

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpub.cpp
# Opt level: O1

void __thiscall zmq::xpub_t::xread_activated(xpub_t *this,pipe_t *pipe_)

{
  iterator *piVar1;
  iterator *piVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  _Elt_pointer pppVar7;
  atomic_counter_t aVar8;
  byte bVar9;
  bool bVar10;
  rm_result rVar11;
  ssize_t sVar12;
  byte *pbVar13;
  byte *prefix_;
  size_t sVar14;
  atomic_counter_t in_RCX;
  void *in_RDX;
  void *__buf;
  int __fd;
  msg_t *this_00;
  pipe_t **__args;
  blob_t *__args_01;
  bool bVar15;
  metadata_t *metadata;
  blob_t notification;
  msg_t msg;
  uchar local_c9;
  atomic_counter_t local_c8;
  pipe_t *local_c0;
  blob_t local_b8;
  deque<zmq::metadata_t*,std::allocator<zmq::metadata_t*>> *local_a0;
  generic_mtrie_t<zmq::pipe_t> *local_98;
  generic_mtrie_t<zmq::pipe_t> *local_90;
  deque<unsigned_char,_std::allocator<unsigned_char>_> *local_88;
  deque<zmq::blob_t,_std::allocator<zmq::blob_t>_> *local_80;
  deque<zmq::pipe_t*,std::allocator<zmq::pipe_t*>> *local_78;
  msg_t local_70;
  uchar *__args_00;
  
  this_00 = &local_70;
  local_c0 = pipe_;
  sVar12 = pipe_t::read(pipe_,(int)this_00,in_RDX,(size_t)in_RCX);
  if ((char)sVar12 != '\0') {
    local_80 = &this->_pending_data;
    local_a0 = (deque<zmq::metadata_t*,std::allocator<zmq::metadata_t*>> *)&this->_pending_metadata;
    local_88 = &this->_pending_flags;
    local_90 = &this->_subscriptions;
    local_98 = &this->_manual_subscriptions;
    local_78 = (deque<zmq::pipe_t*,std::allocator<zmq::pipe_t*>> *)&this->_pending_pipes;
    do {
      __fd = (int)this_00;
      local_c8 = (atomic_counter_t)msg_t::metadata(&local_70);
      pbVar13 = (byte *)msg_t::data(&local_70);
      bVar10 = this->_more_recv;
      bVar9 = msg_t::flags(&local_70);
      this->_more_recv = (bool)(bVar9 & 1);
      if ((bVar10 == true) && (this->_process_subscribe != true)) {
LAB_0018b0c1:
        bVar9 = 0;
        bVar15 = false;
        sVar14 = 0;
        prefix_ = (byte *)0x0;
      }
      else {
        if (((local_70._u.base.flags & 0x1c) == 0x10) || ((local_70._u.base.flags & 0x1c) == 0xc)) {
          prefix_ = (byte *)msg_t::command_body(&local_70);
          sVar14 = msg_t::command_body_size(&local_70);
          bVar15 = (local_70._u.base.flags & 0x1c) == 0xc;
        }
        else {
          sVar14 = msg_t::size(&local_70);
          if ((sVar14 == 0) || (1 < *pbVar13)) goto LAB_0018b0c1;
          prefix_ = pbVar13 + 1;
          sVar14 = msg_t::size(&local_70);
          sVar14 = sVar14 - 1;
          bVar15 = *pbVar13 == 1;
        }
        bVar9 = 1;
      }
      if (bVar10 == false) {
        in_RCX._value.super___atomic_base<unsigned_int>._M_i._0_1_ =
             this->_only_first_subscribe ^ 1U | bVar9;
        this->_process_subscribe =
             (bool)(undefined1)in_RCX._value.super___atomic_base<unsigned_int>._M_i;
      }
      if (bVar9 == 0) {
        if ((this->super_socket_base_t).super_own_t.options.type != '\x01') {
          sVar14 = msg_t::size(&local_70);
          blob_t::blob_t(&local_b8,pbVar13,sVar14);
          std::deque<zmq::blob_t,_std::allocator<zmq::blob_t>_>::emplace_back<zmq::blob_t>
                    (local_80,&local_b8);
          if (local_b8._owned == true) {
            free((void *)CONCAT71(local_b8._data._1_7_,(uchar)local_b8._data));
          }
          if (local_c8 != (atomic_counter_t)0x0) {
            metadata_t::add_ref((metadata_t *)local_c8);
          }
          aVar8 = (atomic_counter_t)
                  (this->_pending_metadata).
                  super__Deque_base<zmq::metadata_t_*,_std::allocator<zmq::metadata_t_*>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
          in_RCX = (atomic_counter_t)
                   ((this->_pending_metadata).
                    super__Deque_base<zmq::metadata_t_*,_std::allocator<zmq::metadata_t_*>_>._M_impl
                    .super__Deque_impl_data._M_finish._M_last + -1);
          if (aVar8 == in_RCX) {
            std::deque<zmq::metadata_t*,std::allocator<zmq::metadata_t*>>::
            _M_push_back_aux<zmq::metadata_t*const&>(local_a0,(metadata_t **)&local_c8);
          }
          else {
            *(atomic_counter_t *)aVar8 = local_c8;
            piVar1 = &(this->_pending_metadata).
                      super__Deque_base<zmq::metadata_t_*,_std::allocator<zmq::metadata_t_*>_>.
                      _M_impl.super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
            in_RCX = local_c8;
          }
          local_b8._data._0_1_ = msg_t::flags(&local_70);
          __args_01 = &local_b8;
          std::deque<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (local_88,(uchar *)__args_01);
          __fd = (int)__args_01;
        }
      }
      else {
        if (this->_manual == true) {
          if (bVar15 == false) {
            pbVar13 = prefix_;
            generic_mtrie_t<zmq::pipe_t>::rm(local_98,prefix_,sVar14,local_c0);
            __fd = (int)pbVar13;
          }
          else {
            pbVar13 = prefix_;
            generic_mtrie_t<zmq::pipe_t>::add(local_98,prefix_,sVar14,local_c0);
            __fd = (int)pbVar13;
          }
          pppVar7 = (this->_pending_pipes).
                    super__Deque_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur;
          if (pppVar7 ==
              (this->_pending_pipes).
              super__Deque_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_last + -1) {
            __args = &local_c0;
            std::deque<zmq::pipe_t*,std::allocator<zmq::pipe_t*>>::
            _M_push_back_aux<zmq::pipe_t*const&>(local_78,__args);
            __fd = (int)__args;
          }
          else {
            *pppVar7 = local_c0;
            piVar2 = &(this->_pending_pipes).
                      super__Deque_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl.
                      super__Deque_impl_data._M_finish;
            piVar2->_M_cur = piVar2->_M_cur + 1;
          }
          in_RCX = (atomic_counter_t)0x0;
        }
        else if (bVar15 == false) {
          pbVar13 = prefix_;
          rVar11 = generic_mtrie_t<zmq::pipe_t>::rm(local_90,prefix_,sVar14,local_c0);
          __fd = (int)pbVar13;
          in_RCX._1_7_ = 0;
          in_RCX._value.super___atomic_base<unsigned_int>._M_i._0_1_ = this->_verbose_unsubs;
          if (rVar11 != values_remain) {
            in_RCX = (atomic_counter_t)0x1;
          }
        }
        else {
          pbVar13 = prefix_;
          bVar10 = generic_mtrie_t<zmq::pipe_t>::add(local_90,prefix_,sVar14,local_c0);
          __fd = (int)pbVar13;
          in_RCX = (atomic_counter_t)0x1;
          if (!bVar10) {
            uVar3 = this->_verbose_subs;
            uVar4 = this->_verbose_unsubs;
            uVar5 = this->_more_send;
            uVar6 = this->_more_recv;
            in_RCX._value.super___atomic_base<unsigned_int>._M_i._3_1_ = uVar6;
            in_RCX._value.super___atomic_base<unsigned_int>._M_i._2_1_ = uVar5;
            in_RCX._value.super___atomic_base<unsigned_int>._M_i._1_1_ = uVar4;
            in_RCX._value.super___atomic_base<unsigned_int>._M_i._0_1_ = uVar3;
            in_RCX._4_4_ = 0;
          }
        }
        if ((this->_manual != false) ||
           (((this->super_socket_base_t).super_own_t.options.type == '\t' &&
            (((ulong)in_RCX & 1) != 0)))) {
          blob_t::blob_t(&local_b8,sVar14 + 1);
          *(bool *)CONCAT71(local_b8._data._1_7_,(uchar)local_b8._data) = bVar15;
          memcpy((void *)(CONCAT71(local_b8._data._1_7_,(uchar)local_b8._data) + 1),prefix_,sVar14);
          std::deque<zmq::blob_t,_std::allocator<zmq::blob_t>_>::emplace_back<zmq::blob_t>
                    (local_80,&local_b8);
          if (local_c8 != (atomic_counter_t)0x0) {
            metadata_t::add_ref((metadata_t *)local_c8);
          }
          aVar8 = (atomic_counter_t)
                  (this->_pending_metadata).
                  super__Deque_base<zmq::metadata_t_*,_std::allocator<zmq::metadata_t_*>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
          in_RCX = (atomic_counter_t)
                   ((this->_pending_metadata).
                    super__Deque_base<zmq::metadata_t_*,_std::allocator<zmq::metadata_t_*>_>._M_impl
                    .super__Deque_impl_data._M_finish._M_last + -1);
          if (aVar8 == in_RCX) {
            std::deque<zmq::metadata_t*,std::allocator<zmq::metadata_t*>>::
            _M_push_back_aux<zmq::metadata_t*const&>(local_a0,(metadata_t **)&local_c8);
          }
          else {
            *(atomic_counter_t *)aVar8 = local_c8;
            piVar1 = &(this->_pending_metadata).
                      super__Deque_base<zmq::metadata_t_*,_std::allocator<zmq::metadata_t_*>_>.
                      _M_impl.super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
            in_RCX = local_c8;
          }
          local_c9 = '\0';
          __args_00 = &local_c9;
          std::deque<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (local_88,__args_00);
          __fd = (int)__args_00;
          if (local_b8._owned == true) {
            free((void *)CONCAT71(local_b8._data._1_7_,(uchar)local_b8._data));
          }
        }
      }
      this_00 = &local_70;
      msg_t::close(this_00,__fd);
      sVar12 = pipe_t::read(local_c0,(int)this_00,__buf,(size_t)in_RCX);
    } while ((char)sVar12 != '\0');
  }
  return;
}

Assistant:

void zmq::xpub_t::xread_activated (pipe_t *pipe_)
{
    //  There are some subscriptions waiting. Let's process them.
    msg_t msg;
    while (pipe_->read (&msg)) {
        metadata_t *metadata = msg.metadata ();
        unsigned char *msg_data = static_cast<unsigned char *> (msg.data ()),
                      *data = NULL;
        size_t size = 0;
        bool subscribe = false;
        bool is_subscribe_or_cancel = false;
        bool notify = false;

        const bool first_part = !_more_recv;
        _more_recv = (msg.flags () & msg_t::more) != 0;

        if (first_part || _process_subscribe) {
            //  Apply the subscription to the trie
            if (msg.is_subscribe () || msg.is_cancel ()) {
                data = static_cast<unsigned char *> (msg.command_body ());
                size = msg.command_body_size ();
                subscribe = msg.is_subscribe ();
                is_subscribe_or_cancel = true;
            } else if (msg.size () > 0 && (*msg_data == 0 || *msg_data == 1)) {
                data = msg_data + 1;
                size = msg.size () - 1;
                subscribe = *msg_data == 1;
                is_subscribe_or_cancel = true;
            }
        }

        if (first_part)
            _process_subscribe =
              !_only_first_subscribe || is_subscribe_or_cancel;

        if (is_subscribe_or_cancel) {
            if (_manual) {
                // Store manual subscription to use on termination
                if (!subscribe)
                    _manual_subscriptions.rm (data, size, pipe_);
                else
                    _manual_subscriptions.add (data, size, pipe_);

                _pending_pipes.push_back (pipe_);
            } else {
                if (!subscribe) {
                    const mtrie_t::rm_result rm_result =
                      _subscriptions.rm (data, size, pipe_);
                    //  TODO reconsider what to do if rm_result == mtrie_t::not_found
                    notify =
                      rm_result != mtrie_t::values_remain || _verbose_unsubs;
                } else {
                    const bool first_added =
                      _subscriptions.add (data, size, pipe_);
                    notify = first_added || _verbose_subs;
                }
            }

            //  If the request was a new subscription, or the subscription
            //  was removed, or verbose mode or manual mode are enabled, store it
            //  so that it can be passed to the user on next recv call.
            if (_manual || (options.type == ZMQ_XPUB && notify)) {
                //  ZMTP 3.1 hack: we need to support sub/cancel commands, but
                //  we can't give them back to userspace as it would be an API
                //  breakage since the payload of the message is completely
                //  different. Manually craft an old-style message instead.
                //  Although with other transports it would be possible to simply
                //  reuse the same buffer and prefix a 0/1 byte to the topic, with
                //  inproc the subscribe/cancel command string is not present in
                //  the message, so this optimization is not possible.
                //  The pushback makes a copy of the data array anyway, so the
                //  number of buffer copies does not change.
                blob_t notification (size + 1);
                if (subscribe)
                    *notification.data () = 1;
                else
                    *notification.data () = 0;
                memcpy (notification.data () + 1, data, size);

                _pending_data.push_back (ZMQ_MOVE (notification));
                if (metadata)
                    metadata->add_ref ();
                _pending_metadata.push_back (metadata);
                _pending_flags.push_back (0);
            }
        } else if (options.type != ZMQ_PUB) {
            //  Process user message coming upstream from xsub socket,
            //  but not if the type is PUB, which never processes user
            //  messages
            _pending_data.push_back (blob_t (msg_data, msg.size ()));
            if (metadata)
                metadata->add_ref ();
            _pending_metadata.push_back (metadata);
            _pending_flags.push_back (msg.flags ());
        }

        msg.close ();
    }
}